

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *pNtk,int fDuplicate)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *__s1;
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  char *__s2;
  int iVar5;
  int iVar6;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,0x3c9,"int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *, int)");
  }
  Abc_NtkIncrementTravId(pNtk);
  iVar6 = 0;
  iVar5 = 0;
  do {
    if (pNtk->vCos->nSize <= iVar6) {
      iVar6 = Abc_NtkLogicHasSimpleCos(pNtk);
      if (iVar6 != 0) {
        return iVar5;
      }
      __assert_fail("Abc_NtkLogicHasSimpleCos(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                    ,0x3eb,"int Abc_NtkLogicMakeSimpleCos2(Abc_Ntk_t *, int)");
    }
    pAVar3 = Abc_NtkCo(pNtk,iVar6);
    pObj = (Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
    if ((pAVar3->field_0x15 & 4) == 0) {
      uVar1 = *(uint *)&pObj->field_0x14 & 0xf;
      if ((uVar1 == 5) || (uVar1 == 2)) {
        pcVar4 = Abc_ObjName(pObj);
        __s2 = Abc_ObjName(pAVar3);
        iVar2 = strcmp(pcVar4,__s2);
        if (iVar2 != 0) goto LAB_001e0c91;
      }
      iVar2 = Abc_NodeIsTravIdCurrent(pObj);
      if (iVar2 == 0) {
        pAVar3 = (Abc_Obj_t *)Abc_ObjName(pAVar3);
        pObj->pNext = pAVar3;
        Abc_NodeSetTravIdCurrent(pObj);
      }
      else {
        __s1 = pObj->pNext;
        pcVar4 = Abc_ObjName(pAVar3);
        iVar2 = strcmp((char *)__s1,pcVar4);
        if (iVar2 != 0) goto LAB_001e0c91;
      }
    }
    else {
LAB_001e0c91:
      Abc_NtkFixCoDriverProblem(pObj,pAVar3,fDuplicate);
      iVar5 = iVar5 + 1;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

int Abc_NtkLogicMakeSimpleCos2( Abc_Ntk_t * pNtk, int fDuplicate )
{
    Abc_Obj_t * pNode, * pDriver;
    int i, nDupGates = 0;
    assert( Abc_NtkIsLogic(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        // if the driver is complemented, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjFaninC0(pNode) )
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
        // if the driver is a CI and has different name, this is an error
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
        {
            Abc_NtkFixCoDriverProblem( pDriver, pNode, fDuplicate );
            nDupGates++;
            continue;
        }
    }
    assert( Abc_NtkLogicHasSimpleCos(pNtk) );
    return nDupGates;
}